

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstree.cpp
# Opt level: O3

BSTNode * __thiscall search::BSTNode::successor(BSTNode *this)

{
  BSTNode *pBVar1;
  BSTNode *pBVar2;
  
  pBVar2 = this->right_;
  do {
    pBVar1 = pBVar2;
    pBVar2 = pBVar2->left_;
  } while (pBVar2 != (BSTNode *)0x0);
  return pBVar1;
}

Assistant:

BSTNode* BSTNode::successor()
    {
        if (right_)
            return right_->min();
        else
        {
            BSTNode* node = this;
            BSTNode* p = parent_;
            while (p && p->right_ == node)
            {
                node = p;
                p = node->parent_;
            }
        }
    }